

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O1

ForeachLoopStatementSyntax * __thiscall
slang::parsing::Parser::parseForeachLoopStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  ForeachLoopListSyntax *loopList;
  StatementSyntax *statement;
  ForeachLoopStatementSyntax *pFVar1;
  Token keyword;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  keyword = ParserBase::consume(&this->super_ParserBase);
  loopList = parseForeachLoopVariables(this);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f85e0;
  local_68.super_SyntaxListBase.childCount = attributes._M_extent._M_extent_value._M_extent_value;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       attributes._M_ptr;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = attributes._M_extent._M_extent_value._M_extent_value;
  statement = parseStatement(this,false,false);
  pFVar1 = syntax::SyntaxFactory::foreachLoopStatement
                     (&this->factory,label,&local_68,keyword,loopList,statement);
  return pFVar1;
}

Assistant:

ForeachLoopStatementSyntax& Parser::parseForeachLoopStatement(NamedLabelSyntax* label,
                                                              AttrList attributes) {

    auto keyword = consume();
    auto& vars = parseForeachLoopVariables();
    return factory.foreachLoopStatement(label, attributes, keyword, vars, parseStatement(false));
}